

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_leak_example.c
# Opt level: O3

int main(int argc,char **argv)

{
  mtrace();
  muntrace();
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    mtrace();

    char *p = malloc(16);

    free(p);

    p = malloc(32);

    muntrace();

    return 0;
}